

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

bool goodform::json::parse_array(istream *input,any *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  vector<std::any,_std::allocator<std::any>_> *this;
  bool bVar4;
  bool bVar5;
  any elem;
  vector<std::any,_std::allocator<std::any>_> local_48;
  
  local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::any::operator=(v,&local_48);
  std::vector<std::any,_std::allocator<std::any>_>::~vector(&local_48);
  cVar1 = std::istream::get();
  bVar5 = false;
  if (cVar1 == '[') {
    bVar4 = false;
    while (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) == 0) {
      strip_white_space(input);
      iVar3 = std::istream::peek();
      bVar5 = iVar3 == 0x5d;
      if (bVar5) {
        std::istream::seekg((long)input,_S_cur);
      }
      else {
        local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar2 = deserialize(input,(any *)&local_48);
        this = get<std::vector<std::any,std::allocator<std::any>>>(v);
        std::vector<std::any,_std::allocator<std::any>_>::emplace_back<std::any>
                  (this,(any *)&local_48);
        bVar4 = !bVar2;
        if (bVar2) {
          strip_white_space(input);
          iVar3 = std::istream::peek();
          bVar5 = iVar3 << 0x18 == 0x5d000000;
          if ((bVar5) || (bVar4 = iVar3 << 0x18 != 0x2c000000, !bVar4)) {
            std::istream::seekg((long)input,_S_cur);
          }
        }
        if (local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
                    super__Vector_impl_data._M_start)(3,&local_48,0);
          local_48.super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
        }
      }
      if (bVar5) {
        return bVar5;
      }
      if (bVar4) {
        return bVar5;
      }
    }
  }
  return bVar5;
}

Assistant:

bool json::parse_array(std::istream& input, any& v)
  {
    v = goodform::array_t();
    char c = (char)input.get();
    bool closingBraceFound = false;
    if (c == '[')
    {
      bool parseError = false;
      while(!closingBraceFound && !parseError && input.good())
      {
        strip_white_space(input);
        if ((closingBraceFound = (input.peek() == ']')))
        {
          input.seekg(1, std::ios::cur);
        }
        else
        {
          any elem;
          parseError = !deserialize(input, elem);
          get<goodform::array_t>(v).push_back(std::move(elem));
          if (!parseError)
          {
            strip_white_space(input);
            c = (char)input.peek();
            if ((closingBraceFound = (c == ']')) || !(parseError = (c != ',')))
              input.seekg(1, std::ios::cur);
          }
        }
      }
    }
    return closingBraceFound;
  }